

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O0

void __thiscall
DelaunayMST::DelaunayMST(DelaunayMST *this,vector<Point2d,_std::allocator<Point2d>_> *points)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  __normal_iterator<KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
  __last;
  size_type sVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 *puVar10;
  void *pvVar11;
  long lVar12;
  DelaunayMST *this_00;
  const_reference pvVar13;
  type pPVar14;
  type pIVar15;
  pointer pPVar16;
  pointer pPVar17;
  pointer pIVar18;
  pointer pIVar19;
  type piVar20;
  undefined4 *puVar21;
  vector<Point2d,_std::allocator<Point2d>_> *in_RSI;
  long in_RDI;
  Point2d PVar22;
  int j;
  int i_1;
  anon_class_1_0_00000001 pointCmp;
  int i;
  unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_> ori;
  IndexPoint2d *in_stack_fffffffffffffe48;
  unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
  *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  __normal_iterator<KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
  in_stack_fffffffffffffe60;
  int local_54;
  int local_50;
  IndexPoint2d local_48;
  int local_2c;
  vector<Point2d,_std::allocator<Point2d>_> *local_10;
  
  local_10 = in_RSI;
  KruskalMST::KruskalMST((KruskalMST *)0x107d1c);
  sVar7 = std::vector<Point2d,_std::allocator<Point2d>_>::size(local_10);
  uVar8 = sVar7 * 0x20 + 0x20;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar8;
  uVar9 = SUB168(auVar1 * ZEXT816(0xc),0);
  if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar10 = (undefined4 *)operator_new__(uVar9);
  puVar21 = puVar10 + uVar8 * 3;
  for (; puVar10 != puVar21; puVar10 = puVar10 + 3) {
    *puVar10 = 0;
    puVar10[1] = 0;
    puVar10[2] = 0;
  }
  std::unique_ptr<DelaunayMST::EListNode[],std::default_delete<DelaunayMST::EListNode[]>>::
  unique_ptr<DelaunayMST::EListNode*,std::default_delete<DelaunayMST::EListNode[]>,void,bool>
            (in_stack_fffffffffffffe50,(EListNode *)in_stack_fffffffffffffe48);
  sVar7 = std::vector<Point2d,_std::allocator<Point2d>_>::size(local_10);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar7 + 1;
  uVar8 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar8);
  memset(pvVar11,0,uVar8);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe50,
             (int *)in_stack_fffffffffffffe48);
  lVar12 = in_RDI + 0x30;
  sVar7 = std::vector<Point2d,_std::allocator<Point2d>_>::size(local_10);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar7 + 1;
  this_00 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    this_00 = (DelaunayMST *)0xffffffffffffffff;
  }
  pvVar11 = operator_new__((ulong)this_00);
  memset(pvVar11,0,(size_t)this_00);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe50,
             (int *)in_stack_fffffffffffffe48);
  sVar7 = std::vector<Point2d,_std::allocator<Point2d>_>::size(local_10);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar7 + 1;
  uVar8 = SUB168(auVar4 * ZEXT816(0x10),0);
  if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar8);
  memset(pvVar11,0,uVar8);
  std::unique_ptr<Point2d[],std::default_delete<Point2d[]>>::
  unique_ptr<Point2d*,std::default_delete<Point2d[]>,void,bool>
            ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)in_stack_fffffffffffffe50,
             &in_stack_fffffffffffffe48->super_Point2d);
  *(undefined4 *)(in_RDI + 0x40) = 1;
  sVar7 = std::vector<Point2d,_std::allocator<Point2d>_>::size(local_10);
  *(int *)(in_RDI + 0x18) = (int)sVar7;
  sVar7 = std::vector<Point2d,_std::allocator<Point2d>_>::size(local_10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar7 + 1;
  uVar8 = SUB168(auVar5 * ZEXT816(0x18),0);
  if (SUB168(auVar5 * ZEXT816(0x18),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar8);
  memset(pvVar11,0,uVar8);
  std::unique_ptr<DelaunayMST::IndexPoint2d[],std::default_delete<DelaunayMST::IndexPoint2d[]>>::
  unique_ptr<DelaunayMST::IndexPoint2d*,std::default_delete<DelaunayMST::IndexPoint2d[]>,void,bool>
            ((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
              *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  for (local_2c = 1; local_2c <= *(int *)(in_RDI + 0x18); local_2c = local_2c + 1) {
    pvVar13 = std::vector<Point2d,_std::allocator<Point2d>_>::operator[]
                        (local_10,(long)(local_2c + -1));
    pPVar14 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                        ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)
                         in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    dVar6 = pvVar13->y;
    pPVar14->x = pvVar13->x;
    pPVar14->y = dVar6;
    pvVar13 = std::vector<Point2d,_std::allocator<Point2d>_>::operator[]
                        (local_10,(long)(local_2c + -1));
    IndexPoint2d::IndexPoint2d(&local_48,pvVar13,local_2c);
    pIVar15 = std::
              unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
              ::operator[]((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                            *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    (pIVar15->super_Point2d).x = local_48.super_Point2d.x;
    (pIVar15->super_Point2d).y = local_48.super_Point2d.y;
    pIVar15->index = local_48.index;
  }
  pPVar16 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::get
                      ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)
                       in_stack_fffffffffffffe50);
  pPVar17 = std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::get
                      ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)
                       in_stack_fffffffffffffe50);
  std::
  sort<Point2d*,DelaunayMST::DelaunayMST(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>
            (pPVar16 + 1,pPVar17 + (long)*(int *)(in_RDI + 0x18) + 1);
  pIVar18 = std::
            unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
            ::get((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                   *)in_stack_fffffffffffffe50);
  pIVar19 = std::
            unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
            ::get((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                   *)in_stack_fffffffffffffe50);
  std::
  sort<DelaunayMST::IndexPoint2d*,DelaunayMST::IndexPoint2d(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>
            (pIVar18 + 1,pIVar19 + (long)*(int *)(in_RDI + 0x18) + 1);
  delaunay(this_00,(int)((ulong)lVar12 >> 0x20),(int)lVar12);
  for (local_50 = 1; local_50 <= *(int *)(in_RDI + 0x18); local_50 = local_50 + 1) {
    piVar20 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                        ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_stack_fffffffffffffe50
                         ,(size_t)in_stack_fffffffffffffe48);
    local_54 = *piVar20;
    while (local_54 != 0) {
      std::
      unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>::
      operator[]((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                  *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>::
      operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      std::
      unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>::
      operator[]((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
                  *)in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)in_stack_fffffffffffffe50
                 ,(size_t)in_stack_fffffffffffffe48);
      std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>::
      operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      std::unique_ptr<Point2d[],_std::default_delete<Point2d[]>_>::operator[]
                ((unique_ptr<Point2d[],_std::default_delete<Point2d[]>_> *)in_stack_fffffffffffffe50
                 ,(size_t)in_stack_fffffffffffffe48);
      PVar22.y._0_4_ = in_stack_fffffffffffffe58;
      PVar22.x = (double)in_stack_fffffffffffffe50;
      PVar22.y._4_4_ = in_stack_fffffffffffffe5c;
      PVar22 = operator-(PVar22,&in_stack_fffffffffffffe48->super_Point2d);
      in_stack_fffffffffffffe58 = PVar22.y._0_4_;
      in_stack_fffffffffffffe5c = PVar22.y._4_4_;
      in_stack_fffffffffffffe60._M_current = (Edge *)PVar22.x;
      in_stack_fffffffffffffe50 =
           (unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_> *)
           Point2d::length((Point2d *)0x1083f5);
      KruskalMST::addEdge((KruskalMST *)in_stack_fffffffffffffe60._M_current,
                          in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,
                          (double)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe48 =
           (IndexPoint2d *)
           std::unique_ptr<DelaunayMST::EListNode[],_std::default_delete<DelaunayMST::EListNode[]>_>
           ::operator[](in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      local_54 = *(int *)((long)&(in_stack_fffffffffffffe48->super_Point2d).x + 4);
    }
  }
  std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>::begin
            ((vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_> *)
             in_stack_fffffffffffffe48);
  std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>::end
            ((vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_> *)
             in_stack_fffffffffffffe48);
  __last._M_current._4_4_ = in_stack_fffffffffffffe5c;
  __last._M_current._0_4_ = in_stack_fffffffffffffe58;
  std::
  sort<__gnu_cxx::__normal_iterator<KruskalMST::Edge*,std::vector<KruskalMST::Edge,std::allocator<KruskalMST::Edge>>>>
            (in_stack_fffffffffffffe60,__last);
  std::unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>::
  ~unique_ptr((unique_ptr<DelaunayMST::IndexPoint2d[],_std::default_delete<DelaunayMST::IndexPoint2d[]>_>
               *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

DelaunayMST(const std::vector<Point2d> &points)
			: last(new int[points.size() + 1]{}), stk(new int[points.size() + 1]{}),
			  p(new Point2d[points.size() + 1]{}), e(new EListNode[(points.size() + 1) * 32]{})
	{
		n = static_cast<int>(points.size());
		std::unique_ptr<IndexPoint2d[]> ori(new IndexPoint2d[points.size() + 1]{});
		for (int i = 1; i <= n; ++i)
			p[i] = points[i - 1], ori[i] = {points[i - 1], i};

		auto pointCmp = [](auto &lhs, auto &rhs)
		{ return lhs.x < rhs.x || lhs.x == rhs.x && lhs.y < rhs.y; };
		std::sort(p.get() + 1, p.get() + 1 + n, pointCmp);
		std::sort(ori.get() + 1, ori.get() + 1 + n, pointCmp);

		delaunay(1, n);

		for (int i = 1; i <= n; ++i)
			for (int j = last[i]; j; j = e[j].prev)
				addEdge(ori[i].index - 1, ori[e[j].to].index - 1, (p[i] - p[e[j].to]).length());
		std::sort(edges.begin(), edges.end());
	}